

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O0

Vec_Int_t * Vec_IntFlopBit(Vec_Int_t *p)

{
  int iVar1;
  int iVar2;
  int local_14;
  int i;
  Vec_Int_t *p_local;
  
  local_14 = 0;
  do {
    if (p->nSize <= local_14) {
      return p;
    }
    if (local_14 + 1 < p->nSize) {
      iVar1 = Abc_Lit2Var(p->pArray[local_14]);
      iVar2 = Abc_Lit2Var(p->pArray[local_14 + 1]);
      if (iVar1 != iVar2) goto LAB_00a16cd2;
      local_14 = local_14 + 1;
    }
    else {
LAB_00a16cd2:
      p->pArray[local_14] = p->pArray[local_14] ^ 1;
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Flips the first bit in all entries of the vector.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static inline Vec_Int_t * Vec_IntFlopBit( Vec_Int_t * p )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
    {
        if ( i+1 < p->nSize && Abc_Lit2Var(p->pArray[i]) == Abc_Lit2Var(p->pArray[i+1]) ) 
            i++; // skip variable appearing as both pos and neg literal
        else
            p->pArray[i] ^= 1;
    }
    return p;
}